

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,float,float>
               (Matrix<float,__1,__1,_1,__1,__1> *dst,
               Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *src,assign_op<float,_float> *param_3)

{
  ulong rows;
  ulong cols;
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  rows = (((src->m_lhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
         m_storage.m_cols;
  cols = (((src->m_rhs).m_diagonal)->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
         m_storage.m_rows;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_rows !=
       rows) ||
     (uVar2 = cols, uVar4 = rows,
     (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_cols != cols
     )) {
    if ((long)(cols | rows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1, 1, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1, 1, -1, -1>]"
                   );
    }
    if ((cols != 0 && rows != 0) &&
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar1 / SEXT816((long)cols),0) < (long)rows)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar1 % SEXT816((long)cols),0));
      *puVar3 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<float,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<float,__1,__1,__1,_1> *)dst,cols * rows,rows,cols);
    uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
    uVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  }
  if ((uVar4 == rows) && (uVar2 == cols)) {
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1, 1, -1, -1>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}